

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

char ** strchrexplode(char *strP,char sep)

{
  code *pcVar1;
  char cVar2;
  uint uVar3;
  char *__s;
  char *pcVar5;
  char **ppcVar6;
  size_t sVar7;
  char *pcVar8;
  char cVar9;
  long lVar10;
  long lVar11;
  int iVar4;
  
  if (strP != (char *)0x0) {
    __s = strdup(strP);
    if (*__s != '\0') {
      lVar11 = 0;
      cVar2 = *__s;
      pcVar5 = __s;
      do {
        cVar9 = cVar2;
        lVar10 = lVar11;
        pcVar5 = pcVar5 + 1;
        lVar11 = (ulong)(cVar9 == sep) + lVar10;
        cVar2 = *pcVar5;
      } while (*pcVar5 != '\0');
      ppcVar6 = (char **)calloc(1,lVar11 * 8 + 0x10);
      sVar7 = strlen(__s);
      uVar3 = (uint)sVar7;
      pcVar5 = __s;
      while( true ) {
        if (uVar3 == 0) {
          if (lVar11 != -1) {
            lVar11 = 0;
            pcVar5 = __s;
            do {
              if (*pcVar5 == '\0') {
                pcVar8 = (char *)malloc(1);
                *pcVar8 = '\0';
              }
              else {
                pcVar8 = strdup(pcVar5);
              }
              ppcVar6[lVar11] = pcVar8;
              sVar7 = strlen(pcVar5);
              pcVar5 = pcVar5 + sVar7 + 1;
              lVar11 = lVar11 + 1;
            } while (lVar10 + 1 + (ulong)(cVar9 == sep) != lVar11);
          }
          free(__s);
          return ppcVar6;
        }
        if (*pcVar5 == sep) {
          *pcVar5 = '\0';
        }
        iVar4 = (int)sVar7;
        uVar3 = iVar4 - 1;
        sVar7 = (size_t)uVar3;
        if (SBORROW4(iVar4,1)) break;
        pcVar5 = pcVar5 + 1;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    free(__s);
  }
  return (char **)0x0;
}

Assistant:

char ** strchrexplode(char * strP, char sep)
{
	unsigned long   count, i;
	char **         array;
	char *          str;
	char *          originalstr;

	if(!strP)
		return 0;

	str = strdup(strP);
	originalstr = str;

	if(strlen(str)==0)
	{
		strfree(originalstr);
		return 0;
	}

	count = strchrcount(str, sep)+1;

	array = (char **)malloc(sizeof(char *)*(count+1));
	memset(array, 0, (sizeof(char *)*(count+1)));

	strchrrep(str, sep, '\0');

	for(i=0;i<count;i++)
	{
		if(!strlen(str))
		{
			array[i] = (char *)malloc(1);
			array[i][0] = '\0';
		}
		else
		   array[i] = strdup(str);

		str = str+strlen(str)+1;
	}

	free(originalstr);

	return array;
}